

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O0

void ut::are_equal<std::pair<int,double>,std::pair<int,double>>
               (pair<int,_double> *expected,pair<int,_double> *actual,LocationInfo *location)

{
  FailedAssertion *this;
  bool bVar1;
  allocator local_41;
  string local_40 [32];
  LocationInfo *local_20;
  LocationInfo *location_local;
  pair<int,_double> *actual_local;
  pair<int,_double> *expected_local;
  
  local_20 = location;
  location_local = (LocationInfo *)actual;
  actual_local = expected;
  bVar1 = std::operator==(expected,actual);
  if (!bVar1) {
    this = (FailedAssertion *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Values are not equal!",&local_41);
    FailedAssertion::FailedAssertion(this,(string *)local_40,local_20);
    __cxa_throw(this,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
  }
  return;
}

Assistant:

inline void are_equal(const T1 &expected, const T2 &actual, const LocationInfo &location)
	{
		if (!(expected == actual))
			throw FailedAssertion("Values are not equal!", location);
	}